

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,-1,-1,1,-1,-1>>::_init2<long,long>
          (PlainObjectBase<Eigen::Matrix<float,_1,_1,1,_1,_1>> *this,Index rows,Index cols,
          type_conflict1 *param_3)

{
  bool t1_is_integer_alike;
  bool t0_is_integer_alike;
  type_conflict1 *param_3_local;
  Index cols_local;
  Index rows_local;
  PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *this_local;
  
  PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *)this,rows,cols);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void _init2(Index rows, Index cols, typename internal::enable_if<Base::SizeAtCompileTime!=2,T0>::type* = 0)
    {
      const bool t0_is_integer_alike = internal::is_valid_index_type<T0>::value;
      const bool t1_is_integer_alike = internal::is_valid_index_type<T1>::value;
      EIGEN_STATIC_ASSERT(t0_is_integer_alike &&
                          t1_is_integer_alike,
                          FLOATING_POINT_ARGUMENT_PASSED__INTEGER_WAS_EXPECTED)
      resize(rows,cols);
    }